

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O1

char * get_netscape_format(Cookie *co)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  
  pcVar7 = "FALSE";
  pcVar5 = "FALSE";
  pcVar2 = "";
  if (co->tailmatch == true) {
    pcVar5 = "TRUE";
    pcVar2 = "";
    if (co->domain != (char *)0x0) {
      pcVar2 = "@cd .";
      if (*co->domain == '.') {
        pcVar2 = "PK\x01\x02";
      }
      pcVar2 = pcVar2 + 4;
      pcVar5 = "TRUE";
    }
  }
  pcVar1 = "unknown";
  if (co->domain != (char *)0x0) {
    pcVar1 = co->domain;
  }
  pcVar6 = "/";
  if (co->path != (char *)0x0) {
    pcVar6 = co->path;
  }
  pcVar3 = co->value;
  if (pcVar3 == (char *)0x0) {
    pcVar3 = "";
  }
  if (co->secure != false) {
    pcVar7 = "TRUE";
  }
  pcVar4 = "#HttpOnly_";
  if (co->httponly == false) {
    pcVar4 = "";
  }
  pcVar2 = curl_maprintf("%s%s%s\t%s\t%s\t%s\t%ld\t%s\t%s",pcVar4,pcVar2,pcVar1,pcVar5,pcVar6,pcVar7
                         ,co->expires,co->name,pcVar3);
  return pcVar2;
}

Assistant:

static char *get_netscape_format(const struct Cookie *co)
{
  return aprintf(
    "%s"     /* httponly preamble */
    "%s%s\t" /* domain */
    "%s\t"   /* tailmatch */
    "%s\t"   /* path */
    "%s\t"   /* secure */
    "%" CURL_FORMAT_CURL_OFF_T "\t"   /* expires */
    "%s\t"   /* name */
    "%s",    /* value */
    co->httponly?"#HttpOnly_":"",
    /* Make sure all domains are prefixed with a dot if they allow
       tailmatching. This is Mozilla-style. */
    (co->tailmatch && co->domain && co->domain[0] != '.')? ".":"",
    co->domain?co->domain:"unknown",
    co->tailmatch?"TRUE":"FALSE",
    co->path?co->path:"/",
    co->secure?"TRUE":"FALSE",
    co->expires,
    co->name,
    co->value?co->value:"");
}